

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O3

SimpleStringMemoryBlock * __thiscall
SimpleStringInternalCache::allocateNewCacheBlockFrom
          (SimpleStringInternalCache *this,SimpleStringInternalCacheNode *node)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleStringMemoryBlock *pSVar3;
  
  sVar1 = node->size_;
  iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x10,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x67);
  pSVar3 = (SimpleStringMemoryBlock *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,sVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x68);
  pSVar3->memory_ = (char *)CONCAT44(extraout_var_00,iVar2);
  pSVar3->next_ = node->usedMemoryHead_;
  node->usedMemoryHead_ = pSVar3;
  return pSVar3;
}

Assistant:

SimpleStringMemoryBlock* SimpleStringInternalCache::allocateNewCacheBlockFrom(SimpleStringInternalCacheNode* node)
{
    SimpleStringMemoryBlock* block = createSimpleStringMemoryBlock(node->size_, node->usedMemoryHead_);
    node->usedMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->usedMemoryHead_);
    return block;
}